

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

mcu8str * mctools_path_join(mcu8str *p1raw,mcu8str *p2raw)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  mcu8str *in_RDI;
  bool bVar6;
  mcu8str *p1copy;
  mcu8str_size_t used;
  mcu8str_size_t newsize;
  mcu8str_size_t s2;
  mcu8str_size_t s1;
  mcu8str_size_t needs_slash;
  mcu8str_size_t minlen1;
  mcu8str_size_t iE2;
  mcu8str_size_t iB2;
  mcu8str_size_t iE1;
  mcu8str_size_t iB1;
  char drive_letter2;
  char drive_letter1;
  char lastchar;
  char native_sep;
  mcu8str p2;
  mcu8str p1;
  undefined5 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4d;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  mcu8str *prealloc_size;
  mcu8str *in_stack_ffffffffffffff68;
  long local_60;
  ulong local_58;
  void *local_40;
  uint local_38;
  void *local_28;
  uint local_20;
  
  prealloc_size = in_RDI;
  mctools_impl_view_no_winnamespace
            ((mcu8str *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  mctools_impl_view_no_winnamespace
            ((mcu8str *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  if (local_38 == 0) {
    if (local_20 == 0) {
      mcu8str_create_empty();
    }
    else {
      cVar1 = *(char *)((long)local_28 + (ulong)(local_20 - 1));
      if ((cVar1 == '\\') || (cVar1 == '/')) {
        mcu8str_copy((mcu8str *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        mctools_pathseps_platform
                  ((mcu8str *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      }
      else {
        mcu8str_create((mcu8str_size_t)prealloc_size);
        mcu8str_append((mcu8str *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (mcu8str *)
                       CONCAT17(in_stack_ffffffffffffff4f,
                                CONCAT16(in_stack_ffffffffffffff4e,
                                         CONCAT15(in_stack_ffffffffffffff4d,
                                                  in_stack_ffffffffffffff48))));
        in_RDI->c_str[in_RDI->size] = '/';
        in_RDI->size = in_RDI->size + 1;
        in_RDI->c_str[in_RDI->size] = '\0';
        mctools_pathseps_platform
                  ((mcu8str *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      }
    }
  }
  else {
    if (local_20 < 2) {
      iVar3 = 0;
    }
    else {
      cVar1 = mctools_drive_letter(in_RDI);
      iVar3 = (int)cVar1;
    }
    cVar1 = (char)iVar3;
    if (local_38 < 2) {
      iVar4 = 0;
    }
    else {
      cVar2 = mctools_drive_letter(in_RDI);
      iVar4 = (int)cVar2;
    }
    cVar2 = (char)iVar4;
    if ((local_20 == 0) || (iVar5 = mctools_path_is_absolute(in_stack_ffffffffffffff68), iVar5 != 0)
       ) {
      if ((cVar1 == '\0') || (cVar2 != '\0')) {
        mcu8str_copy((mcu8str *)CONCAT44(iVar3,iVar4));
        mctools_pathseps_platform((mcu8str *)CONCAT44(iVar3,iVar4));
      }
      else {
        mcu8str_create((mcu8str_size_t)prealloc_size);
        *in_RDI->c_str = cVar1;
        in_RDI->c_str[1] = ':';
        in_RDI->c_str[2] = '\0';
        in_RDI->size = 2;
        mcu8str_append((mcu8str *)CONCAT44(iVar3,iVar4),
                       (mcu8str *)
                       CONCAT17(in_stack_ffffffffffffff4f,
                                CONCAT16(in_stack_ffffffffffffff4e,
                                         CONCAT15(in_stack_ffffffffffffff4d,
                                                  in_stack_ffffffffffffff48))));
        mctools_pathseps_platform((mcu8str *)CONCAT44(iVar3,iVar4));
      }
    }
    else if ((cVar2 == '\0') || (cVar1 == cVar2)) {
      local_58 = (ulong)local_20;
      local_60 = 0;
      if ((cVar1 != '\0') && (cVar1 == cVar2)) {
        local_60 = 2;
      }
      iVar5 = 1;
      if (cVar1 != '\0') {
        iVar5 = 3;
      }
      while( true ) {
        bVar6 = false;
        if (((ulong)(long)iVar5 < local_58) &&
           (((*(char *)((long)local_28 + (local_58 - 1)) == '/' ||
             (bVar6 = false, *(char *)((long)local_28 + (local_58 - 1)) == '\\')) &&
            (bVar6 = true, *(char *)((long)local_28 + (local_58 - 2)) != '/')))) {
          bVar6 = *(char *)((long)local_28 + (local_58 - 2)) == '\\';
        }
        if (!bVar6) break;
        local_58 = local_58 - 1;
      }
      bVar6 = true;
      if (*(char *)((long)local_28 + (local_58 - 1)) != '/') {
        bVar6 = *(char *)((long)local_28 + (local_58 - 1)) == '\\';
      }
      iVar5 = (int)local_58;
      mcu8str_create((mcu8str_size_t)prealloc_size);
      memcpy(in_RDI->c_str,local_28,local_58);
      if (!bVar6 != 0) {
        in_RDI->c_str[local_58] = '/';
        local_58 = local_58 + 1;
      }
      memcpy(in_RDI->c_str + local_58,local_40,((ulong)local_38 - local_60) + 1);
      in_RDI->size = iVar5 + (int)((ulong)local_38 - local_60) + (uint)!bVar6;
      mctools_pathseps_platform((mcu8str *)CONCAT44(iVar3,iVar4));
    }
    else {
      mcu8str_copy((mcu8str *)CONCAT44(iVar3,iVar4));
      mctools_pathseps_platform((mcu8str *)CONCAT44(iVar3,iVar4));
    }
  }
  return prealloc_size;
}

Assistant:

mcu8str mctools_path_join( const mcu8str* p1raw, const mcu8str* p2raw )
  {
    //In general try to mimic os.path.path from Python, although we do not
    //require a drive letter on windows to be considered an absolute path, so we
    //might have slight changes in some weird cases.

    mcu8str p1 = mctools_impl_view_no_winnamespace(p1raw);
    mcu8str p2 = mctools_impl_view_no_winnamespace(p2raw);

#ifdef MC_IS_WINDOWS
    const char native_sep = '\\';
#else
    const char native_sep = '/';
#endif

    if ( p2.size == 0 ) {
      //Simply copy p1, but ensure it ends in a separator:
      if ( !p1.size )
        return mcu8str_create_empty();//special case: join("","")->""
      char lastchar = p1.c_str[p1.size-1];
      if ( lastchar == '\\' || lastchar == '/' ) {
        mcu8str p1copy = mcu8str_copy( &p1 );
        mctools_pathseps_platform(&p1copy);
        return p1copy;
      }
      mcu8str res = mcu8str_create( p1.size + 1 );
      mcu8str_append( &res, &p1 );
      res.c_str[res.size] = native_sep;
      ++( res.size );
      res.c_str[res.size] = '\0';
      mctools_pathseps_platform(&res);
      return res;
    }

    char drive_letter1 = p1.size >= 2 ? mctools_drive_letter(&p1) : 0;
    char drive_letter2 = p2.size >= 2 ? mctools_drive_letter(&p2) : 0;
    if ( p1.size == 0 || mctools_path_is_absolute(&p2) ) {
      //p1 is empty or p2 is an absolute path, so simply discard p1 (like
      //Pythons os.path.join does in this case). However, if there is a drive
      //letter in p1 and not in p2, we use that drive letter:
      if ( drive_letter1 && !drive_letter2 ) {
        mcu8str res = mcu8str_create( p2.size + 2 );
        res.c_str[0] = drive_letter1;
        res.c_str[1] = ':';
        res.c_str[2] = '\0';
        res.size = 2;
        mcu8str_append( &res, &p2 );
        mctools_pathseps_platform(&res);
        return res;
      } else {
        mcu8str p2copy = mcu8str_copy( &p2 );
        mctools_pathseps_platform(&p2copy);
        return p2copy;
      }
    }

    if ( drive_letter2 && drive_letter1 != drive_letter2 ) {
      //p2 has a drive letter and p1 has a different drive letter => simply
      //return p2.
      mcu8str p2copy = mcu8str_copy( &p2 );
      mctools_pathseps_platform(&p2copy);
      return p2copy;
    }

    //Neither p1 or p2 are empty here, so we can simply join them. However, if
    //there is a common drive letter or repeated slashes at the end of p1, we do
    //not repeat them needlessley.

    //Selected ranges:
    mcu8str_size_t iB1 = 0;
    mcu8str_size_t iE1 = p1.size;
    mcu8str_size_t iB2 = 0;
    mcu8str_size_t iE2 = p2.size;

    if ( drive_letter1 && drive_letter1 == drive_letter2 )
      iB2 += 2;//skip common drive letter from p2

    //Strip repeated trailing slashes down to one trailing slash:
    mcu8str_size_t minlen1 = ( drive_letter1 ? 3 : 1 );
    while ( iE1-iB1 > minlen1
            && ( p1.c_str[iE1-1]=='/' || p1.c_str[iE1-1]=='\\' )
            && ( p1.c_str[iE1-2]=='/' || p1.c_str[iE1-2]=='\\' ) )
      --iE1;

    mcu8str_size_t needs_slash = ( ( p1.c_str[iE1-1]=='/'
                                   || p1.c_str[iE1-1]=='\\' ) ? 0 : 1 );

    mcu8str_size_t s1 = iE1-iB1;
    mcu8str_size_t s2 = iE2-iB2;
    mcu8str_size_t newsize = s1 + s2 + needs_slash;
    mcu8str res =  mcu8str_create( newsize  );
    STDNS memcpy( res.c_str, p1.c_str, s1 );
    mcu8str_size_t used = s1;
    if ( needs_slash ) {
      res.c_str[used] = native_sep;
      ++used;
    }
    STDNS memcpy( res.c_str + used, p2.c_str, s2+1 );//+1 to include null char
    res.size = (unsigned)newsize;//cast ok due to mcu8str_create
    mctools_pathseps_platform(&res);
    return res;
  }